

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall IR::IRBuilder::jump(IRBuilder *this,BasicBlock *target)

{
  bool bVar1;
  BasicBlock *local_18;
  _Fwd_list_node_base *local_10;
  
  local_18 = target;
  bVar1 = BasicBlock::isTerminated(this->block_);
  if (!bVar1) {
    std::forward_list<IR::Jump,std::allocator<IR::Jump>>::emplace_front<IR::BasicBlock*&>
              ((forward_list<IR::Jump,std::allocator<IR::Jump>> *)&this->function_->jumps_,&local_18
              );
    local_10 = (this->function_->jumps_).super__Fwd_list_base<IR::Jump,_std::allocator<IR::Jump>_>.
               _M_impl._M_head._M_next + 1;
    std::vector<IR::Stmt*,std::allocator<IR::Stmt*>>::emplace_back<IR::Stmt*>
              ((vector<IR::Stmt*,std::allocator<IR::Stmt*>> *)this->block_,(Stmt **)&local_10);
  }
  return;
}

Assistant:

void IRBuilder::jump(BasicBlock* target) {
  if (block_->isTerminated()) return;
  function_->jumps_.emplace_front(target);
  block_->push_back(&function_->jumps_.front());
}